

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::EnumColumnWriter::FlushDictionary
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,ColumnWriterStatistics *stats_p)

{
  Vector *pVVar1;
  Allocator *args;
  pointer pMVar2;
  char *pcVar3;
  string_t *val;
  idx_t iVar4;
  bool bVar5;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> local_60;
  MemoryStream *local_58;
  uint32_t local_4c;
  idx_t local_48;
  PrimitiveColumnWriter *local_40;
  PrimitiveColumnWriterState *local_38;
  
  local_38 = state;
  pVVar1 = EnumType::GetValuesInsertOrder((LogicalType *)(*(long *)&this->field_0x10 + 0x28));
  local_48 = EnumType::GetSize((LogicalType *)(*(long *)&this->field_0x10 + 0x28));
  val = (string_t *)pVVar1->data;
  local_40 = (PrimitiveColumnWriter *)this;
  args = Allocator::Get((ClientContext *)**(undefined8 **)&this->field_0x8);
  make_uniq<duckdb::MemoryStream,duckdb::Allocator&>((duckdb *)&local_58,args);
  iVar4 = local_48;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 - 1, bVar5) {
    StringStatisticsState::Update((StringStatisticsState *)stats_p,val);
    pMVar2 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
             operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                         *)&local_58);
    local_4c = (val->value).pointer.length;
    (**(pMVar2->super_WriteStream)._vptr_WriteStream)(pMVar2,&local_4c,4);
    pMVar2 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
             operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                         *)&local_58);
    if ((val->value).pointer.length < 0xd) {
      pcVar3 = (char *)((long)&val->value + 4);
    }
    else {
      pcVar3 = (val->value).pointer.ptr;
    }
    (**(pMVar2->super_WriteStream)._vptr_WriteStream)(pMVar2,pcVar3);
    val = val + 1;
  }
  local_60._M_head_impl = local_58;
  local_58 = (MemoryStream *)0x0;
  PrimitiveColumnWriter::WriteDictionary
            (local_40,local_38,
             (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             &local_60,local_48);
  if (local_60._M_head_impl != (MemoryStream *)0x0) {
    (*((local_60._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
  }
  local_60._M_head_impl = (MemoryStream *)0x0;
  if (local_58 != (MemoryStream *)0x0) {
    (**(code **)(*(long *)local_58 + 0x10))();
  }
  return;
}

Assistant:

void EnumColumnWriter::FlushDictionary(PrimitiveColumnWriterState &state, ColumnWriterStatistics *stats_p) {
	auto &stats = stats_p->Cast<StringStatisticsState>();
	// write the enum values to a dictionary page
	auto &enum_values = EnumType::GetValuesInsertOrder(Type());
	auto enum_count = EnumType::GetSize(Type());
	auto string_values = FlatVector::GetData<string_t>(enum_values);
	// first write the contents of the dictionary page to a temporary buffer
	auto temp_writer = make_uniq<MemoryStream>(Allocator::Get(writer.GetContext()));
	for (idx_t r = 0; r < enum_count; r++) {
		D_ASSERT(!FlatVector::IsNull(enum_values, r));
		// update the statistics
		stats.Update(string_values[r]);
		// write this string value to the dictionary
		temp_writer->Write<uint32_t>(string_values[r].GetSize());
		temp_writer->WriteData(const_data_ptr_cast(string_values[r].GetData()), string_values[r].GetSize());
	}
	// flush the dictionary page and add it to the to-be-written pages
	WriteDictionary(state, std::move(temp_writer), enum_count);
}